

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

void __thiscall xercesc_4_0::CMStateSet::operator|=(CMStateSet *this,CMStateSet *setToOr)

{
  uint *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  uint uVar4;
  XMLInt32 **ppXVar5;
  XMLInt32 *pXVar6;
  XMLInt32 **ppXVar7;
  XMLInt32 *pXVar8;
  ulong uVar9;
  ulong uVar10;
  XMLSize_t index;
  ulong uVar11;
  CMDynamicBuffer *pCVar12;
  XMLSize_t subIndex;
  long lVar13;
  XMLSize_t index_00;
  
  pCVar12 = this->fDynamicBuffer;
  if (pCVar12 == (CMDynamicBuffer *)0x0) {
    if (XMLPlatformUtils::fgSSE2ok == '\0') {
      lVar13 = 0;
      do {
        if (setToOr->fBits[lVar13] != 0) {
          this->fBits[lVar13] = this->fBits[lVar13] | setToOr->fBits[lVar13];
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
    }
    else {
      uVar11 = *(ulong *)(setToOr->fBits + 2);
      *(ulong *)this->fBits = *(ulong *)setToOr->fBits | *(ulong *)this->fBits;
      *(ulong *)(this->fBits + 2) = uVar11 | *(ulong *)(this->fBits + 2);
    }
  }
  else if (pCVar12->fArraySize != 0) {
    index_00 = 0;
    do {
      ppXVar5 = setToOr->fDynamicBuffer->fBitArray;
      pXVar6 = ppXVar5[index_00];
      if (pXVar6 != (XMLInt32 *)0x0) {
        ppXVar7 = pCVar12->fBitArray;
        pXVar8 = ppXVar7[index_00];
        if (pXVar8 == (XMLInt32 *)0x0) {
          allocateChunk(this,index_00);
          memcpy(this->fDynamicBuffer->fBitArray[index_00],ppXVar5[index_00],0x80);
        }
        else if (XMLPlatformUtils::fgSSE2ok == '\0') {
          lVar13 = 0;
          do {
            uVar4 = pXVar6[lVar13];
            if (uVar4 != 0) {
              puVar1 = (uint *)(pXVar8 + lVar13);
              *puVar1 = *puVar1 | uVar4;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x20);
        }
        else {
          uVar11 = 0xfffffffffffffffc;
          do {
            pXVar6 = ppXVar7[index_00];
            puVar2 = (ulong *)(pXVar6 + uVar11 + 4);
            uVar9 = puVar2[1];
            uVar10 = *(ulong *)((long)(ppXVar5[index_00] + uVar11 + 4) + 8);
            puVar3 = (ulong *)(pXVar6 + uVar11 + 4);
            *puVar3 = *puVar2 | *(ulong *)(ppXVar5[index_00] + uVar11 + 4);
            puVar3[1] = uVar9 | uVar10;
            uVar11 = uVar11 + 4;
          } while (uVar11 < 0x1c);
        }
      }
      index_00 = index_00 + 1;
      pCVar12 = this->fDynamicBuffer;
    } while (index_00 < pCVar12->fArraySize);
  }
  return;
}

Assistant:

void operator|=(const CMStateSet& setToOr)
    {
        if(fDynamicBuffer==0)
        {
#ifdef XERCES_HAVE_SSE2_INTRINSIC
            if(XMLPlatformUtils::fgSSE2ok)
            {
                __m128i xmm1 = _mm_loadu_si128(reinterpret_cast<const __m128i*>(fBits));
                __m128i xmm2 = _mm_loadu_si128(reinterpret_cast<const __m128i*>(setToOr.fBits));
                __m128i xmm3 = _mm_or_si128(xmm1, xmm2);     //  OR  4 32-bit words
                _mm_storeu_si128(reinterpret_cast<__m128i*>(fBits), xmm3);
            }
            else
#endif
            {
                for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
                    if(setToOr.fBits[index])
                    {
                        if(fBits[index])
                            fBits[index] |= setToOr.fBits[index];
                        else
                            fBits[index] = setToOr.fBits[index];
                    }
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToOr.fDynamicBuffer->fBitArray[index];
                if(other!=NULL)
                {
                    // if we haven't allocated the subvector yet, allocate it and copy
                    if(fDynamicBuffer->fBitArray[index]==NULL)
                    {
                        allocateChunk(index);
                        memcpy((void *) fDynamicBuffer->fBitArray[index],
                               (const void *) other,
                               CMSTATE_BITFIELD_INT32_SIZE * sizeof(XMLInt32));
                    }
                    else
                    {
                        // otherwise, merge them
                        XMLInt32*& mine = fDynamicBuffer->fBitArray[index];
#ifdef XERCES_HAVE_SSE2_INTRINSIC
                        if(XMLPlatformUtils::fgSSE2ok)
                        {
                            for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex+=4)
                            {
                               __m128i xmm1 = _mm_load_si128(reinterpret_cast<const __m128i*>(&other[subIndex]));
                               __m128i xmm2 = _mm_load_si128(reinterpret_cast<const __m128i*>(&mine[subIndex]));
                               __m128i xmm3 = _mm_or_si128(xmm1, xmm2);     //  OR  4 32-bit words
                               _mm_store_si128(reinterpret_cast<__m128i*>(&mine[subIndex]), xmm3);
                            }
                        }
                        else
#endif
                        {
                            for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                                if(setToOr.fDynamicBuffer->fBitArray[index][subIndex])
                                {
                                    if(fDynamicBuffer->fBitArray[index][subIndex])
                                        fDynamicBuffer->fBitArray[index][subIndex] |= setToOr.fDynamicBuffer->fBitArray[index][subIndex];
                                    else
                                        fDynamicBuffer->fBitArray[index][subIndex] = setToOr.fDynamicBuffer->fBitArray[index][subIndex];
                                }
                        }
                    }
                }
            }
        }
    }